

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O2

void __thiscall
chrono::ChFrame<double>::TransformParentToLocal
          (ChFrame<double> *this,ChFrame<double> *parent,ChFrame<double> *local)

{
  undefined1 auVar1 [16];
  ChVector<double> CStack_78;
  ChQuaternion<double> local_60;
  ChQuaternion<double> local_40;
  
  TransformParentToLocal(&CStack_78,this,&(parent->coord).pos);
  local_60.m_data[0] = (this->coord).rot.m_data[0];
  auVar1._0_8_ = -(this->coord).rot.m_data[3];
  auVar1._8_4_ = 0;
  auVar1._12_4_ = 0x80000000;
  local_60.m_data[1]._0_4_ = *(undefined4 *)((this->coord).rot.m_data + 1);
  local_60.m_data[2]._0_4_ = *(undefined4 *)((this->coord).rot.m_data + 2);
  local_60.m_data[1]._4_4_ = *(uint *)((long)(this->coord).rot.m_data + 0xc) ^ 0x80000000;
  local_60.m_data[2]._4_4_ = *(uint *)((long)(this->coord).rot.m_data + 0x14) ^ 0x80000000;
  local_60.m_data[3] = (double)vmovlps_avx(auVar1);
  ChQuaternion<double>::operator%(&local_40,&local_60,&(parent->coord).rot);
  SetCoord(local,&CStack_78,&local_40);
  return;
}

Assistant:

void TransformParentToLocal(
        const ChFrame<Real>& parent,  ///< frame to transform, given in parent coordinates
        ChFrame<Real>& local          ///< transformed frame, in local coordinates, will be stored here
        ) const {
        local.SetCoord(TransformParentToLocal(parent.coord.pos), coord.rot.GetConjugate() % parent.coord.rot);
    }